

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O3

void __thiscall IR::AutoReuseOpnd::~AutoReuseOpnd(AutoReuseOpnd *this)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  if (this->wasInUse == false) {
    pOVar1 = this->opnd;
    bVar4 = pOVar1->field_0xb;
    if ((bVar4 & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x2a,"(m_inUse)","Expected inUse to be set...");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      bVar4 = pOVar1->field_0xb;
    }
    pOVar1->field_0xb = bVar4 & 0xfd;
    if (this->autoDelete == true) {
      Opnd::Free(this->opnd,this->func);
    }
  }
  return;
}

Assistant:

~AutoReuseOpnd()
    {
        if(wasInUse)
        {
            return;
        }

        opnd->UnUse();
        if(autoDelete)
        {
            opnd->Free(func);
        }
    }